

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr
xmlNewIOInputStream(xmlParserCtxtPtr ctxt,xmlParserInputBufferPtr input,xmlCharEncoding enc)

{
  xmlGenericErrorFunc p_Var1;
  int *piVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlParserInputPtr inputStream;
  xmlCharEncoding enc_local;
  xmlParserInputBufferPtr input_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (input == (xmlParserInputBufferPtr)0x0) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    piVar2 = __xmlParserDebugEntities();
    if (*piVar2 != 0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"new input from I/O\n");
    }
    ctxt_local = (xmlParserCtxtPtr)xmlNewInputStream(ctxt);
    if (ctxt_local == (xmlParserCtxtPtr)0x0) {
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      ctxt_local->userData = (char *)0x0;
      ctxt_local->sax = (_xmlSAXHandler *)input;
      xmlBufResetInput((xmlBufPtr)ctxt_local->sax->resolveEntity,(xmlParserInputPtr)ctxt_local);
      if (enc != XML_CHAR_ENCODING_NONE) {
        xmlSwitchEncoding(ctxt,enc);
      }
    }
  }
  return (xmlParserInputPtr)ctxt_local;
}

Assistant:

xmlParserInputPtr
xmlNewIOInputStream(xmlParserCtxtPtr ctxt, xmlParserInputBufferPtr input,
	            xmlCharEncoding enc) {
    xmlParserInputPtr inputStream;

    if (input == NULL) return(NULL);
    if (xmlParserDebugEntities)
	xmlGenericError(xmlGenericErrorContext, "new input from I/O\n");
    inputStream = xmlNewInputStream(ctxt);
    if (inputStream == NULL) {
	return(NULL);
    }
    inputStream->filename = NULL;
    inputStream->buf = input;
    xmlBufResetInput(inputStream->buf->buffer, inputStream);

    if (enc != XML_CHAR_ENCODING_NONE) {
        xmlSwitchEncoding(ctxt, enc);
    }

    return(inputStream);
}